

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::ConfigureSubDirectory(cmMakefile *this,cmMakefile *mf)

{
  bool bVar1;
  PolicyStatus PVar2;
  string *psVar3;
  ostream *poVar4;
  PolicyID id;
  PolicyID id_00;
  cmAlphaNum local_218;
  string currentStartFile;
  string currentStart;
  string msg_1;
  ostringstream e;
  
  InitializeFromParent(mf,this);
  psVar3 = GetCurrentSourceDirectory_abi_cxx11_(mf);
  std::__cxx11::string::string((string *)&currentStart,(string *)psVar3);
  if (this->GlobalGenerator->CMakeInstance->DebugOutput == true) {
    _e = 0x18;
    local_218.View_._M_len = currentStart._M_string_length;
    local_218.View_._M_str = currentStart._M_dataplus._M_p;
    cmStrCat<>(&currentStartFile,(cmAlphaNum *)&e,&local_218);
    cmSystemTools::Message(&currentStartFile,(char *)0x0);
    std::__cxx11::string::~string((string *)&currentStartFile);
  }
  std::operator+(&currentStartFile,&currentStart,"/CMakeLists.txt");
  bVar1 = cmsys::SystemTools::FileExists(&currentStartFile,true);
  if (bVar1) {
    Configure(mf);
    if (this->GlobalGenerator->CMakeInstance->DebugOutput == true) {
      _e = 0x18;
      psVar3 = GetCurrentSourceDirectory_abi_cxx11_(this);
      local_218.View_._M_str = (psVar3->_M_dataplus)._M_p;
      local_218.View_._M_len = psVar3->_M_string_length;
      cmStrCat<>(&msg_1,(cmAlphaNum *)&e,&local_218);
      cmSystemTools::Message(&msg_1,(char *)0x0);
      std::__cxx11::string::~string((string *)&msg_1);
    }
    goto LAB_001ed6b2;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  poVar4 = std::operator<<((ostream *)&e,"The source directory\n");
  poVar4 = std::operator<<(poVar4,"  ");
  poVar4 = std::operator<<(poVar4,(string *)&currentStart);
  poVar4 = std::operator<<(poVar4,"\n");
  std::operator<<(poVar4,"does not contain a CMakeLists.txt file.");
  PVar2 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0014,false);
  if (PVar2 - REQUIRED_IF_USED < 2) {
    poVar4 = std::operator<<((ostream *)&e,"\n");
    cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)&local_218,(cmPolicies *)0xe,id);
    std::operator<<(poVar4,(string *)&local_218);
    std::__cxx11::string::~string((string *)&local_218);
LAB_001ed5ec:
    std::__cxx11::stringbuf::str();
    IssueMessage(this,FATAL_ERROR,(string *)&local_218);
LAB_001ed69d:
    std::__cxx11::string::~string((string *)&local_218);
  }
  else {
    if (PVar2 == WARN) {
      poVar4 = std::operator<<((ostream *)&e,"\n");
      poVar4 = std::operator<<(poVar4,"CMake does not support this case but it used ");
      poVar4 = std::operator<<(poVar4,"to work accidentally and is being allowed for ");
      poVar4 = std::operator<<(poVar4,"compatibility.");
      poVar4 = std::operator<<(poVar4,"\n");
      cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&local_218,(cmPolicies *)0xe,id_00);
      std::operator<<(poVar4,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::stringbuf::str();
      IssueMessage(this,AUTHOR_WARNING,(string *)&local_218);
      goto LAB_001ed69d;
    }
    if (PVar2 == NEW) goto LAB_001ed5ec;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
LAB_001ed6b2:
  std::__cxx11::string::~string((string *)&currentStartFile);
  std::__cxx11::string::~string((string *)&currentStart);
  return;
}

Assistant:

void cmMakefile::ConfigureSubDirectory(cmMakefile* mf)
{
  mf->InitializeFromParent(this);
  std::string currentStart = mf->GetCurrentSourceDirectory();
  if (this->GetCMakeInstance()->GetDebugOutput()) {
    std::string msg = cmStrCat("   Entering             ", currentStart);
    cmSystemTools::Message(msg);
  }

  std::string const currentStartFile = currentStart + "/CMakeLists.txt";
  if (!cmSystemTools::FileExists(currentStartFile, true)) {
    // The file is missing.  Check policy CMP0014.
    std::ostringstream e;
    /* clang-format off */
    e << "The source directory\n"
      << "  " << currentStart << "\n"
      << "does not contain a CMakeLists.txt file.";
    /* clang-format on */
    switch (this->GetPolicyStatus(cmPolicies::CMP0014)) {
      case cmPolicies::WARN:
        // Print the warning.
        /* clang-format off */
        e << "\n"
          << "CMake does not support this case but it used "
          << "to work accidentally and is being allowed for "
          << "compatibility."
          << "\n"
          << cmPolicies::GetPolicyWarning(cmPolicies::CMP0014);
        /* clang-format on */
        this->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior does not warn.
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        e << "\n" << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0014);
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior prints the error.
        this->IssueMessage(MessageType::FATAL_ERROR, e.str());
        break;
    }
    return;
  }
  // finally configure the subdir
  mf->Configure();

  if (this->GetCMakeInstance()->GetDebugOutput()) {
    std::string msg =
      cmStrCat("   Returning to         ", this->GetCurrentSourceDirectory());
    cmSystemTools::Message(msg);
  }
}